

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall helics::CommonCore::setAsUsed(CommonCore *this,BasicHandleInfo *hand)

{
  shared_mutex *__rwlock;
  int iVar1;
  BasicHandleInfo *pBVar2;
  
  if (hand->used != false) {
    return;
  }
  hand->used = true;
  __rwlock = &(this->handles).m_mutex;
  iVar1 = pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
  if (iVar1 != 0x23) {
    pBVar2 = HandleManager::getHandleInfo
                       (&(this->handles).m_obj,(InterfaceHandle)(hand->handle).handle.hid);
    pBVar2->used = true;
    pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
    return;
  }
  std::__throw_system_error(0x23);
}

Assistant:

void CommonCore::setAsUsed(BasicHandleInfo* hand)
{
    assert(hand != nullptr);
    if (hand->used) {
        return;
    }
    hand->used = true;
    handles.modify([&](auto& handle) { handle.getHandleInfo(hand->handle.handle)->used = true; });
}